

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToUnsigned(char *str,uint *value)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  
  bVar2 = *str;
  pcVar4 = "%u";
  if (-1 < (char)bVar2) {
    pbVar3 = (byte *)(str + 1);
    do {
      iVar1 = isspace((uint)bVar2);
      if (iVar1 == 0) {
        if ((bVar2 == 0x30) && (pcVar4 = "%u", (*pbVar3 & 0xdf) == 0x58)) {
          pcVar4 = "%x";
        }
        break;
      }
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (-1 < (char)bVar2);
  }
  iVar1 = __isoc99_sscanf(str,pcVar4,value);
  return iVar1 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned(const char* str, unsigned* value)
{
    if (TIXML_SSCANF(str, IsPrefixHex(str) ? "%x" : "%u", value) == 1) {
        return true;
    }
    return false;
}